

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

url_mapper * __thiscall cppcms::url_mapper::data::is_app(data *this,string_key *key)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator sp;
  const_iterator kp;
  map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20 [3];
  url_mapper *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
       ::find((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x3be236);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
       ::end((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = (url_mapper *)0x0;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                  *)0x3be27b);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                  *)0x3be296);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      local_8 = (url_mapper *)0x0;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
                             *)0x3be2d1);
      if ((ppVar2->second).child == (application *)0x0) {
        local_8 = (url_mapper *)0x0;
      }
      else {
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>::
        operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
                    *)0x3be2e2);
        local_8 = application::mapper((application *)0x3be2eb);
      }
    }
  }
  return local_8;
}

Assistant:

url_mapper *is_app(string_key const &key) const
		{
			by_key_type::const_iterator kp = by_key.find(key);
			if(kp == by_key.end())
				return 0;
			by_size_type::const_iterator sp = kp->second.begin();
			if(sp==kp->second.end())
				return 0;
			if(sp->second.child) 
				return &sp->second.child->mapper();
			return 0;
		}